

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

void __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::rehash
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,size_t n)

{
  size_t sVar1;
  pointer pvVar2;
  pointer ppVar3;
  pointer pvVar4;
  pointer pvVar5;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *bucket;
  pointer pvVar6;
  ulong uVar7;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *__range2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2_1;
  pointer pvVar8;
  undefined1 *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  pair<int,_int> *val_1;
  pair<int,_int> *ppVar14;
  ValueT *val;
  pair<int,_int> *ppVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> tmp;
  pair<int,_int> *local_78;
  pair<int,_int> *ppStack_70;
  pair<int,_int> *local_68;
  size_type local_58;
  pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
  local_50;
  
  pvVar6 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pvVar2 - (long)pvVar6 >> 3;
  uVar7 = lVar10 * -0x5555555555555555;
  if ((uVar7 < n) ||
     (sVar1 = this->mSize, auVar16._8_4_ = (int)(sVar1 >> 0x20), auVar16._0_8_ = sVar1,
     auVar16._12_4_ = 0x45300000, auVar17._8_4_ = (int)(uVar7 >> 0x20), auVar17._0_8_ = uVar7,
     auVar17._12_4_ = 0x45300000,
     this->mMaxLoadFactor <=
     (float)(((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
            ((auVar17._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0))))) {
    uVar7 = lVar10 * 0x5555555555555556;
    if (uVar7 <= n) {
      uVar7 = n;
    }
    uVar11 = 0x100;
    puVar9 = PRIMES;
    do {
      uVar12 = uVar11 >> 1;
      uVar13 = ~uVar12 + uVar11;
      uVar11 = uVar12;
      if (*(ulong *)((long)puVar9 + uVar12 * 8) < uVar7) {
        puVar9 = (undefined1 *)((ulong *)((long)puVar9 + uVar12 * 8) + 1);
        uVar11 = uVar13;
      }
    } while (0 < (long)uVar11);
    local_58 = *(size_type *)puVar9;
    local_78 = (pair<int,_int> *)0x0;
    ppStack_70 = (pair<int,_int> *)0x0;
    local_68 = (pair<int,_int> *)0x0;
    ppVar15 = (pvVar6->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pvVar8 = pvVar6;
    if ((pvVar6 != pvVar2) &&
       (pvVar4 = pvVar6,
       (pvVar6->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
       _M_impl.super__Vector_impl_data._M_finish == ppVar15)) {
      do {
        pvVar8 = pvVar4 + 1;
        if (pvVar8 == pvVar2) break;
        ppVar15 = (pvVar8->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pvVar5 = pvVar4 + 1;
        pvVar4 = pvVar8;
      } while (ppVar15 ==
               (pvVar5->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    }
    ppVar14 = *(pair<int,_int> **)((long)pvVar6 + ((long)pvVar2 - (long)pvVar6) + -0x10);
    while (ppVar15 != ppVar14) {
      if (ppStack_70 == local_68) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_78,
                   (iterator)ppStack_70,ppVar15);
      }
      else {
        *ppStack_70 = *ppVar15;
        ppStack_70 = ppStack_70 + 1;
      }
      ppVar15 = ppVar15 + 1;
      if (pvVar8 != pvVar2) {
        while ((ppVar15 ==
                (pvVar8->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish && (pvVar8 = pvVar8 + 1, pvVar8 != pvVar2)
               )) {
          ppVar15 = (pvVar8->
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
      }
    }
    pvVar2 = (this->mBuckets).
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar6 = (this->mBuckets).
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar6 != pvVar2; pvVar6 = pvVar6 + 1)
    {
      ppVar3 = (pvVar6->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar6->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
          _M_impl.super__Vector_impl_data._M_finish != ppVar3) {
        (pvVar6->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = ppVar3;
      }
    }
    this->mSize = 0;
    std::
    vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::resize(&this->mBuckets,local_58);
    ppVar15 = ppStack_70;
    if (local_78 != ppStack_70) {
      ppVar14 = local_78;
      do {
        insert(&local_50,this,ppVar14);
        ppVar14 = ppVar14 + 1;
      } while (ppVar14 != ppVar15);
    }
    if (local_78 != (pair<int,_int> *)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
  }
  return;
}

Assistant:

void rehash(size_t n) {
      if (load_factor() < max_load_factor() && n <= mBuckets.size()) return;
      n = std::max(n, mBuckets.size()*2);
      n = *std::lower_bound(PRIMES,PRIMES+N_PRIMES,n);

      std::vector<ValueT> tmp;
      for (auto& val : *this) {
        tmp.push_back(val);
      }
      this->clear();
      mBuckets.resize(n);
      for (auto& val : tmp) {
        this->insert(val);
      }
    }